

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O3

wstring * __thiscall
mjs::number_to_precision_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double x,int p)

{
  uint uVar1;
  int k_00;
  wstring *pwVar2;
  wchar_t wVar3;
  double m_00;
  wstring m;
  wstring s;
  int k;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_98;
  pointer local_78 [2];
  size_type local_68 [2];
  ecvt_result local_54;
  double local_38;
  
  local_38 = x;
  if ((0x7fefffffffffffff < (ulong)ABS(x)) || (k_00 = (int)this, 0x14 < k_00 - 1U)) {
    __assert_fail("std::isfinite(x) && p >= 1 && p <= 21",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                  ,0xd9,"std::wstring mjs::number_to_precision(double, int)");
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_98);
  m_00 = local_38;
  if (local_38 < 0.0) {
    std::__cxx11::wstring::_M_replace
              ((ulong)&local_98,0,(wchar_t *)local_98._M_string_length,0x1a0e3c);
    m_00 = -local_38;
  }
  anon_unknown_1::do_ecvt(&local_54,m_00,k_00);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::wstring::_M_construct<char*>
            ((wstring *)&local_d8,local_54.s,local_54.s + local_54.k);
  uVar1 = local_54.n - 1;
  if (local_54.n < -5 || k_00 < local_54.n) {
    local_54.n = uVar1;
    if ((1 < local_d8._M_string_length) &&
       (std::__cxx11::wstring::_M_replace_aux((ulong)&local_d8,1,0,L'\x01'), local_54.n == 0)) {
      std::__cxx11::wstring::append((wchar_t *)&local_d8);
      uVar1 = local_54.n;
      goto LAB_001604f3;
    }
    if (local_54.n < 1) {
      __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                (&local_f8,vswprintf,0x10,L"%d",(ulong)(uint)-local_54.n);
      pwVar2 = (wstring *)std::__cxx11::wstring::replace((ulong)&local_f8,0,(wchar_t *)0x0,0x1b00e8)
      ;
      std::__cxx11::wstring::wstring((wstring *)local_b8,pwVar2);
      std::__cxx11::wstring::_M_append((wchar_t *)&local_d8,(ulong)local_b8[0]);
    }
    else {
      __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>(&local_f8,vswprintf,0x10,L"%d");
      pwVar2 = (wstring *)std::__cxx11::wstring::replace((ulong)&local_f8,0,(wchar_t *)0x0,0x1b00dc)
      ;
      std::__cxx11::wstring::wstring((wstring *)local_b8,pwVar2);
      std::__cxx11::wstring::_M_append((wchar_t *)&local_d8,(ulong)local_b8[0]);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] * 4 + 4);
    }
    local_68[0] = local_f8.field_2._M_allocated_capacity;
    uVar1 = local_54.n;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_001604f3;
  }
  else {
    if (local_54.n == k_00) goto LAB_001604f3;
    if (0 < local_54.n) {
      local_54.n = uVar1;
      std::__cxx11::wstring::_M_replace_aux((ulong)&local_d8,(ulong)uVar1 * 4 + 4 >> 2,0,L'\x01');
      uVar1 = local_54.n;
      goto LAB_001604f3;
    }
    wVar3 = -local_54.n;
    local_78[0] = (pointer)local_68;
    local_54.n = uVar1;
    std::__cxx11::wstring::_M_construct((ulong)local_78,wVar3);
    pwVar2 = (wstring *)std::__cxx11::wstring::replace((ulong)local_78,0,(wchar_t *)0x0,0x1b00f4);
    std::__cxx11::wstring::wstring((wstring *)&local_f8,pwVar2);
    pwVar2 = (wstring *)
             std::__cxx11::wstring::_M_append((wchar_t *)&local_f8,(ulong)local_d8._M_dataplus._M_p)
    ;
    std::__cxx11::wstring::wstring((wstring *)local_b8,pwVar2);
    std::__cxx11::wstring::operator=((wstring *)&local_d8,(wstring *)local_b8);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity * 4 + 4);
    }
    local_f8._M_dataplus._M_p = local_78[0];
    uVar1 = local_54.n;
    if (local_78[0] == (pointer)local_68) goto LAB_001604f3;
  }
  operator_delete(local_f8._M_dataplus._M_p,local_68[0] * 4 + 4);
  uVar1 = local_54.n;
LAB_001604f3:
  local_54.n = uVar1;
  std::operator+(__return_storage_ptr__,&local_98,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring number_to_precision(double x, int p) {
    // HACK HACK
    assert(std::isfinite(x) && p >= 1 && p <= 21);
    std::wstring s = L"";
    if (x < 0) {
        s = L"-";
        x = -x;
    }

    auto [k, e, digits] = do_ecvt(x, p);
    std::wstring m = std::wstring{digits, digits+k};
    e--;
    if (e < -6 || e >= p) {
        if (m.size() > 1) {
            m.insert(m.begin() + 1, L'.');
        }
        if (e == 0) {
            m += L"e+0";
        } else if (e > 0) {
            m += L"e+" + std::to_wstring(e);
        } else {
            m += L"e-" + std::to_wstring(-e);
        }
    } else if (e == p - 1) {
    } else if (e >= 0) {
        m.insert(m.begin() + e + 1, L'.');
    } else {
        m = L"0." + std::wstring(-(e+1), L'0') + m;
    }

    return s + m;
}